

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

uint32_t __thiscall fasttext::Dictionary::hash(Dictionary *this,string *str)

{
  uint uVar1;
  size_type sVar2;
  
  if (str->_M_string_length != 0) {
    uVar1 = 0x811c9dc5;
    sVar2 = 0;
    do {
      uVar1 = ((int)(str->_M_dataplus)._M_p[sVar2] ^ uVar1) * 0x1000193;
      sVar2 = sVar2 + 1;
    } while (str->_M_string_length != sVar2);
    return uVar1;
  }
  return 0x811c9dc5;
}

Assistant:

uint32_t Dictionary::hash(const std::string& str) const {
	uint32_t h = 2166136261;
	for (size_t i = 0; i < str.size(); i++) {
		h = h ^ uint32_t(int8_t(str[i]));
		h = h * 16777619;
	}
	return h;
}